

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::multAdd<double,double>
          (SSVectorBase<double> *this,double xx,SVectorBase<double> *vec)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  Real RVar12;
  double dVar13;
  double local_38;
  
  local_38 = xx;
  if (this->setupStatus != true) {
    VectorBase<double>::multAdd<double,double>(&this->super_VectorBase<double>,&local_38,vec);
    return this;
  }
  pdVar5 = (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)(uint)vec->memused;
  bVar6 = false;
LAB_001d2664:
  uVar10 = uVar7 & 0xffffffff;
  lVar8 = uVar7 * 0x10 + -8;
  do {
    uVar7 = uVar7 - 1;
    if ((int)uVar10 < 1) {
      if (!bVar6) {
        return this;
      }
      piVar9 = (this->super_IdxSet).idx;
      piVar1 = piVar9 + (this->super_IdxSet).num;
      piVar11 = piVar9;
      for (; piVar9 < piVar1; piVar9 = piVar9 + 1) {
        dVar2 = pdVar5[*piVar9];
        RVar12 = Tolerances::epsilon((this->_tolerances).
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if (ABS(dVar2) <= RVar12) {
          pdVar5[*piVar9] = 0.0;
        }
        else {
          *piVar11 = *piVar9;
          piVar11 = piVar11 + 1;
        }
      }
      (this->super_IdxSet).num = (int)((ulong)((long)piVar11 - (long)(this->super_IdxSet).idx) >> 2)
      ;
      return this;
    }
    iVar3 = *(int *)((long)&vec->m_elem->val + lVar8);
    dVar2 = pdVar5[iVar3];
    dVar13 = *(double *)((long)vec->m_elem + lVar8 + -8) * xx;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      RVar12 = Tolerances::epsilon((this->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (ABS(dVar2 + dVar13) <= RVar12) break;
      pdVar5[iVar3] = dVar2 + dVar13;
    }
    else {
      RVar12 = Tolerances::epsilon((this->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar12 < ABS(dVar13)) {
        pdVar5[iVar3] = dVar13;
        iVar4 = (this->super_IdxSet).num;
        (this->super_IdxSet).num = iVar4 + 1;
        (this->super_IdxSet).idx[iVar4] = iVar3;
      }
    }
    uVar10 = (ulong)((int)uVar10 - 1);
    lVar8 = lVar8 + -0x10;
  } while( true );
  pdVar5[iVar3] = 1e-100;
  bVar6 = true;
  goto LAB_001d2664;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::multAdd(S xx, const SVectorBase<T>& vec)
{
   if(isSetup())
   {
      R* v = VectorBase<R>::val.data();
      R x;
      bool adjust = false;
      int j;

      for(int i = vec.size() - 1; i >= 0; --i)
      {
         j = vec.index(i);

         if(v[j] != 0)
         {
            x = v[j] + xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
               v[j] = x;
            else
            {
               adjust = true;
               v[j] = SOPLEX_VECTOR_MARKER;
            }
         }
         else
         {
            x = xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
            {
               v[j] = x;
               addIdx(j);
            }
         }
      }

      if(adjust)
      {
         int* iptr = idx;
         int* iiptr = idx;
         int* endptr = idx + num;

         for(; iptr < endptr; ++iptr)
         {
            x = v[*iptr];

            if(isNotZero(x, this->tolerances()->epsilon()))
               *iiptr++ = *iptr;
            else
               v[*iptr] = 0;
         }

         num = int(iiptr - idx);
      }
   }
   else
      VectorBase<R>::multAdd(xx, vec);

   assert(isConsistent());

   return *this;
}